

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::DeepScanLineInputFile::Data::LineBufferTask::~LineBufferTask(LineBufferTask *this)

{
  ~LineBufferTask(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

~LineBufferTask () override
        {
            _line_group->push (_line);
        }